

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

char * SetNew(void)

{
  char *pcVar1;
  
  pcVar1 = (char *)calloc((long)size,1);
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  memory_error();
}

Assistant:

char *SetNew(){
  char *s;
  s = (char*)calloc( size, 1);
  if( s==0 ){
    extern void memory_error();
    memory_error();
  }
  return s;
}